

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O3

void __thiscall BCL::write<int>(BCL *this,int *src,GlobalPtr<int> dst,size_t size)

{
  int *__dest;
  long *plVar1;
  debug_error *pdVar2;
  size_type *psVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  MPI_Request request;
  GlobalPtr<int> dst_local;
  
  dst_local.ptr = dst.rank;
  dst_local.rank = (size_t)src;
  if (my_nprocs < src) {
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string((string *)&request,(unsigned_long)src);
    std::operator+(&local_90,"BCL write(): request to write to rank ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&request);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70._M_dataplus._M_p = (pointer)*plVar1;
    psVar3 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar3) {
      local_70.field_2._M_allocated_capacity = *psVar3;
      local_70.field_2._8_8_ = plVar1[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar3;
    }
    local_70._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    debug_error::debug_error(pdVar2,&local_70);
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  if (my_rank == src) {
    __dest = GlobalPtr<int>::local(&dst_local);
    memcpy(__dest,this,dst.ptr << 2);
  }
  else {
    iVar4 = (int)dst.ptr << 2;
    iVar4 = MPI_Rput(this,iVar4,&ompi_mpi_char,(ulong)src & 0xffffffff,dst_local.ptr,iVar4,
                     &ompi_mpi_char,win,&request);
    if (iVar4 != 0) {
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar4);
      std::operator+(&local_70,"BCL write(): MPI_Rput return error code.",&local_90);
      debug_error::debug_error(pdVar2,&local_70);
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
    iVar4 = MPI_Wait(&request,0);
    if (iVar4 != 0) {
      pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
      std::__cxx11::to_string(&local_90,iVar4);
      std::operator+(&local_70,"BCL write(): MPI_Wait return error code ",&local_90);
      debug_error::debug_error(pdVar2,&local_70);
      __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
    }
  }
  return;
}

Assistant:

inline void write(const T *src, GlobalPtr<T> dst, size_t size) {
  BCL_DEBUG(
    if (dst.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL write(): request to write to rank " +
                        std::to_string(dst.rank) + ", which does not exist");
    }
  )
  if (dst.rank == BCL::rank()) {
    std::memcpy(dst.local(), src, size*sizeof(T));
  } else {
    MPI_Request request;

    int error_code = MPI_Rput(src, size*sizeof(T), MPI_CHAR,
                              dst.rank, dst.ptr, size*sizeof(T), MPI_CHAR,
                              BCL::win, &request);
    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Rput return error code." + std::to_string(error_code));
            }
    )

    error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

    BCL_DEBUG(
            if (error_code != MPI_SUCCESS) {
              throw debug_error("BCL write(): MPI_Wait return error code " + std::to_string(error_code));
            }
    )
  }
}